

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int32_t get_child_list_count(miniscript_node_t *node)

{
  miniscript_node_t *local_20;
  miniscript_node_t *chain;
  int32_t ret;
  miniscript_node_t *node_local;
  
  chain._4_4_ = 0;
  for (local_20 = node->child; local_20 != (miniscript_node_t *)0x0; local_20 = local_20->next) {
    chain._4_4_ = chain._4_4_ + 1;
  }
  return chain._4_4_;
}

Assistant:

static int32_t get_child_list_count(struct miniscript_node_t *node)
{
    int32_t ret = 0;
    struct miniscript_node_t *chain = node->child;
    while (chain != NULL) {
        ++ret;
        chain = chain->next;
    }
    return ret;
}